

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_id_list_around(REF_CELL ref_cell,REF_INT node,REF_INT max_ids,REF_INT *n_ids,REF_INT *ids)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  REF_INT cell;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  *n_ids = 0;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_cell->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_cell->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar7].ref;
    do {
      uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x4fc,"ref_cell_id_list_around",(ulong)uVar4,"nodes");
        return uVar4;
      }
      lVar5 = (long)*n_ids;
      if (lVar5 < 1) {
LAB_001ad479:
        if (max_ids <= *n_ids) {
          return 7;
        }
        ids[lVar5] = local_a8[ref_cell->node_per];
        *n_ids = *n_ids + 1;
      }
      else {
        lVar6 = 0;
        bVar3 = false;
        do {
          if (local_a8[ref_cell->node_per] == ids[lVar6]) {
            bVar3 = true;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        if (!bVar3) goto LAB_001ad479;
      }
      pRVar2 = ref_cell->ref_adj->item;
      iVar1 = pRVar2[(int)uVar7].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar2[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around(REF_CELL ref_cell, REF_INT node,
                                           REF_INT max_ids, REF_INT *n_ids,
                                           REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;

  *n_ids = 0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}